

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O2

double __thiscall chrono::ChFunction_Poly::Get_y(ChFunction_Poly *this,double x)

{
  double dVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  undefined1 auVar4 [64];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  dVar5 = 0.0;
  lVar3 = 0;
  while (lVar3 <= this->order) {
    dVar1 = this->coeff[lVar3];
    auVar4._0_8_ = pow(x,(double)(int)lVar3);
    auVar4._8_56_ = extraout_var;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar5;
    lVar3 = lVar3 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar1;
    auVar2 = vfmadd231sd_fma(auVar6,auVar4._0_16_,auVar2);
    dVar5 = auVar2._0_8_;
  }
  return dVar5;
}

Assistant:

double ChFunction_Poly::Get_y(double x) const {
    double total = 0;
    for (int i = 0; i <= order; i++) {
        total += (coeff[i] * pow(x, (double)i));
    }
    return total;
}